

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Nrom_creation_fails_with_bad_rom_sizes_Test::TestBody
          (Nrom_creation_fails_with_bad_rom_sizes_Test *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  Mapper in_R8D;
  AssertHelper local_888;
  Message local_880 [2];
  invalid_argument *anon_var_0_3;
  type e_3;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> tmp_3;
  undefined1 local_838 [7];
  bool gtest_caught_expected_3;
  TrueWithString gtest_msg_3;
  string local_690;
  AssertHelper local_670;
  Message local_668 [2];
  invalid_argument *anon_var_0_2;
  type e_2;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> tmp_2;
  undefined1 local_620 [7];
  bool gtest_caught_expected_2;
  TrueWithString gtest_msg_2;
  string local_478;
  AssertHelper local_458;
  Message local_450 [2];
  invalid_argument *anon_var_0_1;
  type e_1;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> tmp_1;
  undefined1 local_408 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  string local_260;
  AssertHelper local_240;
  Message local_238 [2];
  invalid_argument *anon_var_0;
  type e;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> local_1f8;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> tmp;
  undefined1 local_1e8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  stringstream local_1b8 [8];
  stringstream ss;
  undefined1 local_30 [8];
  string bytes;
  Nrom_creation_fails_with_bad_rom_sizes_Test *this_local;
  
  bytes.field_2._8_8_ = this;
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_30,(_anonymous_namespace_ *)0x0,'\x01','\0',in_R8D);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_30,_Var2);
  memset(local_1e8,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_1e8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_1e8);
  if (bVar1) {
    tmp._M_t.super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
    super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
    super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      n_e_s::core::RomFactory::from_bytes((RomFactory *)&local_1f8,(istream *)local_1b8);
      std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
                (&local_1f8);
    }
    if ((tmp._M_t.super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>.
         _M_t.super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
         super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
                );
      goto LAB_0023d103;
    }
  }
  else {
LAB_0023d103:
    testing::Message::Message(local_238);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x74,pcVar3);
    in_R8D = (Mapper)pcVar3;
    testing::internal::AssertHelper::operator=(&local_240,local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(local_238);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_1e8);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_260,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(gtest_msg_1.value.field_2._M_local_buf + 8),(string *)local_30,_Var2);
  std::__cxx11::stringstream::operator=
            (local_1b8,(stringstream *)(gtest_msg_1.value.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(gtest_msg_1.value.field_2._M_local_buf + 8));
  memset(local_408,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_408);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_408);
  if (bVar1) {
    tmp_1._M_t.super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>.
    _M_t.super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
    super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      n_e_s::core::RomFactory::from_bytes((RomFactory *)&e_1,(istream *)local_1b8);
      std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
                ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)&e_1);
    }
    if ((tmp_1._M_t.
         super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
         super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
         super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
                 "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
                );
      goto LAB_0023d51a;
    }
  }
  else {
LAB_0023d51a:
    testing::Message::Message(local_450);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_408);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x79,pcVar3);
    in_R8D = (Mapper)pcVar3;
    testing::internal::AssertHelper::operator=(&local_458,local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message(local_450);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_408);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_478,(_anonymous_namespace_ *)0x3,'\x01','\0',in_R8D);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_478);
  std::__cxx11::string::~string((string *)&local_478);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(gtest_msg_2.value.field_2._M_local_buf + 8),(string *)local_30,_Var2);
  std::__cxx11::stringstream::operator=
            (local_1b8,(stringstream *)(gtest_msg_2.value.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(gtest_msg_2.value.field_2._M_local_buf + 8));
  memset(local_620,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_620);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_620);
  if (bVar1) {
    tmp_2._M_t.super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>.
    _M_t.super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
    super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      n_e_s::core::RomFactory::from_bytes((RomFactory *)&e_2,(istream *)local_1b8);
      std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
                ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)&e_2);
    }
    if ((tmp_2._M_t.
         super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
         super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
         super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                 "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
                );
      goto LAB_0023d911;
    }
  }
  else {
LAB_0023d911:
    testing::Message::Message(local_668);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_620);
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x7d,pcVar3);
    in_R8D = (Mapper)pcVar3;
    testing::internal::AssertHelper::operator=(&local_670,local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    testing::Message::~Message(local_668);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_620);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_690,(_anonymous_namespace_ *)0x1,'\x02','\0',in_R8D);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_690);
  std::__cxx11::string::~string((string *)&local_690);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(gtest_msg_3.value.field_2._M_local_buf + 8),(string *)local_30,_Var2);
  std::__cxx11::stringstream::operator=
            (local_1b8,(stringstream *)(gtest_msg_3.value.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(gtest_msg_3.value.field_2._M_local_buf + 8));
  memset(local_838,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_838);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_838);
  if (bVar1) {
    tmp_3._M_t.super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>.
    _M_t.super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
    super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      n_e_s::core::RomFactory::from_bytes((RomFactory *)&e_3,(istream *)local_1b8);
      std::unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>::~unique_ptr
                ((unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)&e_3);
    }
    if ((tmp_3._M_t.
         super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
         super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
         super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl._7_1_ & 1) != 0)
    goto LAB_0023ddb3;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838,
               "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_880);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838
                     );
  testing::internal::AssertHelper::AssertHelper
            (&local_888,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_rom.cpp"
             ,0x81,pcVar3);
  testing::internal::AssertHelper::operator=(&local_888,local_880);
  testing::internal::AssertHelper::~AssertHelper(&local_888);
  testing::Message::~Message(local_880);
LAB_0023ddb3:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_838);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Nrom, creation_fails_with_bad_rom_sizes) {
    std::string bytes{nrom_bytes(0, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 1, Mapper::Nrom);
    bytes.pop_back();
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(3, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 2, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);
}